

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test.cc
# Opt level: O0

void __thiscall xLearn::READER_TEST_CreateReader_Test::TestBody(READER_TEST_CreateReader_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  undefined8 in_stack_fffffffffffffea8;
  undefined1 success;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  string local_118 [24];
  undefined8 in_stack_ffffffffffffff00;
  AssertHelper local_f8;
  Message local_f0;
  AssertionResult local_e8;
  string local_d8;
  AssertHelper local_b8;
  Message local_b0;
  AssertionResult local_a8;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  AssertionResult local_68;
  string local_58;
  AssertHelper local_38;
  Message local_30 [3];
  AssertionResult local_18;
  
  success = (undefined1)((ulong)in_stack_fffffffffffffea8 >> 0x38);
  CreateReader((char *)in_stack_ffffffffffffff00);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
             (bool)success);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message(local_30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,(internal *)&local_18,(AssertionResult *)"CreateReader(\"memory\") != NULL"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/reader_test.cc"
               ,0x177,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    testing::Message::~Message((Message *)0x153607);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15367f);
  CreateReader((char *)in_stack_ffffffffffffff00);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
             (bool)success);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_68);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_68,(AssertionResult *)"CreateReader(\"disk\") != NULL",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/reader_test.cc"
               ,0x178,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x153799);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x153811);
  CreateReader((char *)in_stack_ffffffffffffff00);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
             (bool)success);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)&local_a8,(AssertionResult *)"CreateReader(\"\") == NULL",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/reader_test.cc"
               ,0x179,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    testing::Message::~Message((Message *)0x15392b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1539a3);
  CreateReader((char *)in_stack_ffffffffffffff00);
  this_00 = &local_e8;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
             SUB81((ulong)this_00 >> 0x38,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_118,(internal *)&local_e8,
               (AssertionResult *)"CreateReader(\"unknow_name\") == NULL","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/reader_test.cc"
               ,0x17a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string(local_118);
    testing::Message::~Message((Message *)0x153a9a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x153b06);
  return;
}

Assistant:

TEST(READER_TEST, CreateReader) {
  EXPECT_TRUE(CreateReader("memory") != NULL);
  EXPECT_TRUE(CreateReader("disk") != NULL);
  EXPECT_TRUE(CreateReader("") == NULL);
  EXPECT_TRUE(CreateReader("unknow_name") == NULL);
}